

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detour.c
# Opt level: O0

int detour_uninstall(detour d,detour_handle handle)

{
  uint uVar1;
  void *pvVar2;
  void *in_RSI;
  plugin in_RDI;
  int result;
  uint local_4;
  
  if ((in_RDI == (plugin)0x0) || (in_RSI == (void *)0x0)) {
    log_write_impl_va("metacall",0x86,"detour_uninstall",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/detour/source/detour.c"
                      ,LOG_LEVEL_ERROR,"Invalid uninstall arguments");
    local_4 = 1;
  }
  else {
    pvVar2 = plugin_iface(in_RDI);
    uVar1 = (**(code **)((long)pvVar2 + 0x10))(*(undefined8 *)((long)in_RSI + 8));
    if (uVar1 != 0) {
      log_write_impl_va("metacall",0x8f,"detour_uninstall",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/detour/source/detour.c"
                        ,LOG_LEVEL_ERROR,"Invalid detour implementation handle uninstallation");
    }
    pvVar2 = plugin_iface(in_RDI);
    local_4 = (**(code **)((long)pvVar2 + 0x18))(*(undefined8 *)((long)in_RSI + 8));
    local_4 = local_4 | uVar1;
    if (local_4 != 0) {
      log_write_impl_va("metacall",0x96,"detour_uninstall",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/detour/source/detour.c"
                        ,LOG_LEVEL_ERROR,"Invalid detour implementation handle destruction");
    }
    free(in_RSI);
  }
  return local_4;
}

Assistant:

int detour_uninstall(detour d, detour_handle handle)
{
	int result = 0;

	if (d == NULL || handle == NULL)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid uninstall arguments");

		return 1;
	}

	result |= detour_iface(d)->uninstall(handle->impl);

	if (result != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid detour implementation handle uninstallation");
	}

	result |= detour_iface(d)->destroy(handle->impl);

	if (result != 0)
	{
		log_write("metacall", LOG_LEVEL_ERROR, "Invalid detour implementation handle destruction");
	}

	free(handle);

	return result;
}